

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O3

void __thiscall r_exec::Group::_update_activation(Group *this,GroupState *state,View *view)

{
  pointer *pppCVar1;
  iterator __position;
  float fVar2;
  float fVar3;
  float fVar4;
  double dVar5;
  double dVar6;
  Controller *local_20;
  
  fVar2 = r_exec::View::get_act(view);
  (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
    super__Object._vptr__Object[5])(this,3);
  fVar3 = (float)r_code::Atom::asFloat();
  dVar5 = update_act(this,view);
  (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
    super__Object._vptr__Object[5])(this,3);
  fVar4 = (float)r_code::Atom::asFloat();
  dVar6 = (double)fVar4;
  if ((state->was_c_active == true) && (state->was_c_salient == true)) {
    if ((state->is_c_active != true) || (state->is_c_salient == false)) {
LAB_0016f0de:
      (*((view->controller).object)->_vptr__Object[6])();
      return;
    }
    if (fVar2 <= fVar3) {
      if (dVar6 < dVar5) {
        (*((view->controller).object)->_vptr__Object[5])();
        local_20 = (Controller *)(view->controller).object;
        std::vector<r_exec::Controller_*,_std::allocator<r_exec::Controller_*>_>::push_back
                  (&this->new_controllers,&local_20);
      }
    }
    else if (dVar5 <= dVar6) goto LAB_0016f0de;
  }
  else if ((state->is_c_active == true) && ((dVar6 < dVar5 && (state->is_c_salient != false)))) {
    (*((view->controller).object)->_vptr__Object[5])();
    local_20 = (Controller *)(view->controller).object;
    __position._M_current =
         (this->new_controllers).
         super__Vector_base<r_exec::Controller_*,_std::allocator<r_exec::Controller_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->new_controllers).
        super__Vector_base<r_exec::Controller_*,_std::allocator<r_exec::Controller_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<r_exec::Controller*,std::allocator<r_exec::Controller*>>::
      _M_realloc_insert<r_exec::Controller*>
                ((vector<r_exec::Controller*,std::allocator<r_exec::Controller*>> *)
                 &this->new_controllers,__position,&local_20);
    }
    else {
      *__position._M_current = local_20;
      pppCVar1 = &(this->new_controllers).
                  super__Vector_base<r_exec::Controller_*,_std::allocator<r_exec::Controller_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppCVar1 = *pppCVar1 + 1;
    }
  }
  return;
}

Assistant:

void Group::_update_activation(GroupState *state, View *view)
{
    bool view_was_active = view->get_act() > get_act_thr();
    bool view_is_active = update_act(view) > get_act_thr();

    // kill newly inactive controllers, register newly active ones.
    if (state->was_c_active && state->was_c_salient) {
        if (!state->is_c_active || !state->is_c_salient) { // group is not c-active and c-salient anymore: kill the view's controller.
            view->controller->lose_activation();
        } else { // group remains c-active and c-salient.
            if (!view_was_active) {
                if (view_is_active) { // register the controller for the newly active ipgm view.
                    view->controller->gain_activation();
                    new_controllers.push_back(view->controller);
                }
            } else {
                if (!view_is_active) { // kill the newly inactive ipgm view's overlays.
                    view->controller->lose_activation();
                }
            }
        }
    } else if (state->is_c_active && state->is_c_salient) { // group becomes c-active and c-salient.
        if (view_is_active) { // register the controller for any active ipgm view.
            view->controller->gain_activation();
            new_controllers.push_back(view->controller);
        }
    }
}